

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_initialize_destroy_multiple_test.cpp
# Opt level: O0

void __thiscall
metacall_initialize_destroy_multiple_test_DefaultConstructor_Test::
~metacall_initialize_destroy_multiple_test_DefaultConstructor_Test
          (metacall_initialize_destroy_multiple_test_DefaultConstructor_Test *this)

{
  void *in_RDI;
  
  ~metacall_initialize_destroy_multiple_test_DefaultConstructor_Test
            ((metacall_initialize_destroy_multiple_test_DefaultConstructor_Test *)0x10afe8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_F(metacall_initialize_destroy_multiple_test, DefaultConstructor)
{
	metacall_print_info();

	ASSERT_EQ((int)0, (int)metacall_initialize());

	ASSERT_EQ((int)0, (int)metacall_initialize());

/* Mock */
#if defined(OPTION_BUILD_LOADERS_MOCK)
	{
		static const char *mock_scripts[] = {
			"empty.mock"
		};

		static const char tag[] = "mock";

		ASSERT_EQ((int)1, (int)metacall_is_initialized(tag));

		EXPECT_EQ((int)0, (int)metacall_load_from_file(tag, mock_scripts, sizeof(mock_scripts) / sizeof(mock_scripts[0]), NULL));

		ASSERT_EQ((int)0, (int)metacall_is_initialized(tag));

		metacall_destroy();

		ASSERT_EQ((int)1, (int)metacall_is_initialized(tag));
	}
#endif /* OPTION_BUILD_LOADERS_MOCK */

	metacall_destroy();

	metacall_destroy();
}